

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O0

Ivy_Obj_t * Ivy_Exor(Ivy_Man_t *p,Ivy_Obj_t *p0,Ivy_Obj_t *p1)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *p1_local;
  Ivy_Obj_t *p0_local;
  Ivy_Man_t *p_local;
  
  pIVar1 = Ivy_Not(p1);
  pIVar1 = Ivy_And(p,p0,pIVar1);
  pIVar2 = Ivy_Not(p0);
  pIVar2 = Ivy_And(p,pIVar2,p1);
  pIVar1 = Ivy_Or(p,pIVar1,pIVar2);
  return pIVar1;
}

Assistant:

Ivy_Obj_t * Ivy_Exor( Ivy_Man_t * p, Ivy_Obj_t * p0, Ivy_Obj_t * p1 )
{
/*
    // check trivial cases
    if ( p0 == p1 )
        return Ivy_Not(p->pConst1);
    if ( p0 == Ivy_Not(p1) )
        return p->pConst1;
    if ( Ivy_Regular(p0) == p->pConst1 )
        return Ivy_NotCond( p1, p0 == p->pConst1 );
    if ( Ivy_Regular(p1) == p->pConst1 )
        return Ivy_NotCond( p0, p1 == p->pConst1 );
    // check the table
    return Ivy_CanonExor( p, p0, p1 );
*/
    return Ivy_Or( p, Ivy_And(p, p0, Ivy_Not(p1)), Ivy_And(p, Ivy_Not(p0), p1) );
}